

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::X3DImporter::FindNodeElement_FromNode
          (X3DImporter *this,CX3DImporter_NodeElement *pStartNode,string *pID,EType pType,
          CX3DImporter_NodeElement **pElement)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar4;
  _List_node_base *p_Var5;
  
  if ((pStartNode->Type == pType) && (_Var2 = std::operator==(&pStartNode->ID,pID), _Var2)) {
    if (pElement == (CX3DImporter_NodeElement **)0x0) {
      return true;
    }
    *pElement = pStartNode;
    return true;
  }
  plVar4 = &pStartNode->Child;
  p_Var5 = (_List_node_base *)plVar4;
  do {
    p_Var5 = (((_List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    bVar1 = p_Var5 != (_List_node_base *)plVar4;
    if (p_Var5 == (_List_node_base *)plVar4) {
      return bVar1;
    }
    bVar3 = FindNodeElement_FromNode
                      (this,(CX3DImporter_NodeElement *)p_Var5[1]._M_next,pID,pType,pElement);
  } while (!bVar3);
  return bVar1;
}

Assistant:

bool X3DImporter::FindNodeElement_FromNode(CX3DImporter_NodeElement* pStartNode, const std::string& pID,
													const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
    bool found = false;// flag: true - if requested element is found.

	// Check if pStartNode - this is the element, we are looking for.
	if((pStartNode->Type == pType) && (pStartNode->ID == pID))
	{
		found = true;
        if ( pElement != nullptr )
        {
            *pElement = pStartNode;
        }

		goto fne_fn_end;
	}// if((pStartNode->Type() == pType) && (pStartNode->ID() == pID))

	// Check childs of pStartNode.
	for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = pStartNode->Child.begin(); ch_it != pStartNode->Child.end(); ++ch_it)
	{
		found = FindNodeElement_FromNode(*ch_it, pID, pType, pElement);
        if ( found )
        {
            break;
        }
	}// for(std::list<CX3DImporter_NodeElement*>::iterator ch_it = it->Child.begin(); ch_it != it->Child.end(); ch_it++)

fne_fn_end:

	return found;
}